

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkillTree.cpp
# Opt level: O2

bool __thiscall SkillTree::tick(SkillTree *this,PixelGameEngine *pge,int64_t *internetPoints)

{
  bool bVar1;
  bool bVar2;
  __node_base *p_Var3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>_>
  *__range1;
  
  p_Var3 = &(this->nodes)._M_h._M_before_begin;
  bVar2 = false;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    bVar1 = SkillTreeNode::tick((SkillTreeNode *)(p_Var3 + 5),pge,this,internetPoints);
    bVar2 = (bool)(bVar2 | bVar1);
  }
  return bVar2;
}

Assistant:

bool SkillTree::tick(olc::PixelGameEngine *pge, std::int64_t &internetPoints) {
    bool completedOne = false;
    for (auto &node : nodes) {
	if (node.second.tick(pge, *this, internetPoints)) {
	    completedOne = true;
	}
    }
    return completedOne;
}